

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmContinueCommand.cxx
# Opt level: O0

bool cmContinueCommand(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *args,cmExecutionStatus *status)

{
  bool bVar1;
  cmMakefile *pcVar2;
  allocator<char> local_79;
  string local_78;
  allocator<char> local_41;
  string local_40;
  cmExecutionStatus *local_20;
  cmExecutionStatus *status_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  
  local_20 = status;
  status_local = (cmExecutionStatus *)args;
  pcVar2 = cmExecutionStatus::GetMakefile(status);
  bVar1 = cmMakefile::IsLoopBlock(pcVar2);
  if (bVar1) {
    cmExecutionStatus::SetContinueInvoked(local_20);
    bVar1 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)status_local);
    if (!bVar1) {
      pcVar2 = cmExecutionStatus::GetMakefile(local_20);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_78,"The CONTINUE command does not accept any arguments.",&local_79
                );
      cmMakefile::IssueMessage(pcVar2,FATAL_ERROR,&local_78);
      std::__cxx11::string::~string((string *)&local_78);
      std::allocator<char>::~allocator(&local_79);
      cmSystemTools::SetFatalErrorOccurred();
    }
  }
  else {
    pcVar2 = cmExecutionStatus::GetMakefile(local_20);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,
               "A CONTINUE command was found outside of a proper FOREACH or WHILE loop scope.",
               &local_41);
    cmMakefile::IssueMessage(pcVar2,FATAL_ERROR,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
    cmSystemTools::SetFatalErrorOccurred();
  }
  return true;
}

Assistant:

bool cmContinueCommand(std::vector<std::string> const& args,
                       cmExecutionStatus& status)
{
  if (!status.GetMakefile().IsLoopBlock()) {
    status.GetMakefile().IssueMessage(
      MessageType::FATAL_ERROR,
      "A CONTINUE command was found outside of a "
      "proper FOREACH or WHILE loop scope.");
    cmSystemTools::SetFatalErrorOccurred();
    return true;
  }

  status.SetContinueInvoked();

  if (!args.empty()) {
    status.GetMakefile().IssueMessage(
      MessageType::FATAL_ERROR,
      "The CONTINUE command does not accept any "
      "arguments.");
    cmSystemTools::SetFatalErrorOccurred();
    return true;
  }

  return true;
}